

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCloneWildcardNsConstraints
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaWildcardPtr dest,xmlSchemaWildcardPtr source)

{
  _xmlSchemaWildcardNs *p_Var1;
  int iVar2;
  xmlSchemaWildcardNsPtr pxVar3;
  xmlSchemaWildcardNsPtr pxVar4;
  xmlSchemaWildcardNsPtr pxVar5;
  
  iVar2 = -1;
  if (dest != (xmlSchemaWildcardPtr)0x0 && source != (xmlSchemaWildcardPtr)0x0) {
    dest->any = source->any;
    pxVar4 = source->nsSet;
    if (pxVar4 != (xmlSchemaWildcardNsPtr)0x0) {
      pxVar5 = (xmlSchemaWildcardNsPtr)0x0;
      do {
        pxVar3 = (xmlSchemaWildcardNsPtr)(*xmlMalloc)(0x10);
        if (pxVar3 == (xmlSchemaWildcardNsPtr)0x0) {
          xmlSchemaPErrMemory(ctxt);
          return -1;
        }
        pxVar3->next = (_xmlSchemaWildcardNs *)0x0;
        pxVar3->value = (xmlChar *)0x0;
        pxVar3->value = pxVar4->value;
        if (pxVar5 == (xmlSchemaWildcardNsPtr)0x0) {
          pxVar5 = (xmlSchemaWildcardNsPtr)&dest->nsSet;
        }
        pxVar5->next = pxVar3;
        pxVar4 = pxVar4->next;
        pxVar5 = pxVar3;
      } while (pxVar4 != (_xmlSchemaWildcardNs *)0x0);
    }
    pxVar4 = dest->negNsSet;
    while (pxVar4 != (xmlSchemaWildcardNsPtr)0x0) {
      p_Var1 = pxVar4->next;
      (*xmlFree)(pxVar4);
      pxVar4 = p_Var1;
    }
    if (source->negNsSet == (xmlSchemaWildcardNsPtr)0x0) {
      dest->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
    }
    else {
      pxVar4 = (xmlSchemaWildcardNsPtr)(*xmlMalloc)(0x10);
      if (pxVar4 == (xmlSchemaWildcardNsPtr)0x0) {
        xmlSchemaPErrMemory(ctxt);
        dest->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
        return -1;
      }
      pxVar4->next = (_xmlSchemaWildcardNs *)0x0;
      pxVar4->value = (xmlChar *)0x0;
      dest->negNsSet = pxVar4;
      pxVar4->value = source->negNsSet->value;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaCloneWildcardNsConstraints(xmlSchemaParserCtxtPtr ctxt,
				    xmlSchemaWildcardPtr dest,
				    xmlSchemaWildcardPtr source)
{
    xmlSchemaWildcardNsPtr cur, tmp, last;

    if ((source == NULL) || (dest == NULL))
	return(-1);
    dest->any = source->any;
    cur = source->nsSet;
    last = NULL;
    while (cur != NULL) {
	tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (tmp == NULL)
	    return(-1);
	tmp->value = cur->value;
	if (last == NULL)
	    dest->nsSet = tmp;
	else
	    last->next = tmp;
	last = tmp;
	cur = cur->next;
    }
    if (dest->negNsSet != NULL)
	xmlSchemaFreeWildcardNsSet(dest->negNsSet);
    if (source->negNsSet != NULL) {
	dest->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (dest->negNsSet == NULL)
	    return(-1);
	dest->negNsSet->value = source->negNsSet->value;
    } else
	dest->negNsSet = NULL;
    return(0);
}